

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

SUNErrCode
N_VScaleAddMultiVectorArray_Serial
          (int nvec,int nsum,sunrealtype *a,N_Vector *X,N_Vector **Y,N_Vector **Z)

{
  N_Vector x;
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  N_Vector *Y_00;
  N_Vector *Z_00;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  uVar4 = (ulong)(uint)nsum;
  x = *X;
  if (nvec == 1) {
    if (nsum == 1) {
      N_VLinearSum_Serial(*a,x,1.0,**Y,**Z);
    }
    else {
      Y_00 = (N_Vector *)malloc((long)nsum << 3);
      Z_00 = (N_Vector *)malloc((long)nsum << 3);
      if (0 < nsum) {
        uVar5 = 0;
        do {
          Y_00[uVar5] = *Y[uVar5];
          Z_00[uVar5] = *Z[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      N_VScaleAddMulti_Serial(nsum,a,x,Y_00,Z_00);
      free(Y_00);
      free(Z_00);
    }
  }
  else if (nsum == 1) {
    N_VLinearSumVectorArray_Serial(nvec,*a,X,1.0,*Y,*Z);
  }
  else {
    lVar1 = *x->content;
    if (Y == Z) {
      if (0 < nvec) {
        uVar5 = 0;
        do {
          if (0 < nsum) {
            lVar2 = *(long *)((long)X[uVar5]->content + 0x10);
            uVar6 = 0;
            do {
              if (0 < lVar1) {
                lVar3 = *(long *)((long)Y[uVar6][uVar5]->content + 0x10);
                lVar7 = 0;
                do {
                  *(double *)(lVar3 + lVar7 * 8) =
                       a[uVar6] * *(double *)(lVar2 + lVar7 * 8) + *(double *)(lVar3 + lVar7 * 8);
                  lVar7 = lVar7 + 1;
                } while (lVar1 != lVar7);
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 != uVar4);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)nvec);
      }
    }
    else if (0 < nvec) {
      uVar5 = 0;
      do {
        if (0 < nsum) {
          lVar2 = *(long *)((long)X[uVar5]->content + 0x10);
          uVar6 = 0;
          do {
            if (0 < lVar1) {
              lVar3 = *(long *)((long)Y[uVar6][uVar5]->content + 0x10);
              lVar7 = *(long *)((long)Z[uVar6][uVar5]->content + 0x10);
              lVar8 = 0;
              do {
                *(double *)(lVar7 + lVar8 * 8) =
                     a[uVar6] * *(double *)(lVar2 + lVar8 * 8) + *(double *)(lVar3 + lVar8 * 8);
                lVar8 = lVar8 + 1;
              } while (lVar1 != lVar8);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar4);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)nvec);
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VScaleAddMultiVectorArray_Serial(int nvec, int nsum,
                                              sunrealtype* a, N_Vector* X,
                                              N_Vector** Y, N_Vector** Z)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i, j;
  sunindextype k, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;
  sunrealtype* zd = NULL;
  N_Vector* YY;
  N_Vector* ZZ;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1 && nsum >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* ---------------------------
   * Special cases for nvec == 1
   * --------------------------- */

  if (nvec == 1)
  {
    /* should have called N_VLinearSum */
    if (nsum == 1)
    {
      N_VLinearSum_Serial(a[0], X[0], ONE, Y[0][0], Z[0][0]);
      SUNCheckLastErr();
      return SUN_SUCCESS;
    }

    /* should have called N_VScaleAddMulti */
    YY = (N_Vector*)malloc(nsum * sizeof(N_Vector));
    SUNAssert(YY, SUN_ERR_MALLOC_FAIL);
    ZZ = (N_Vector*)malloc(nsum * sizeof(N_Vector));
    SUNAssert(ZZ, SUN_ERR_MALLOC_FAIL);

    for (j = 0; j < nsum; j++)
    {
      YY[j] = Y[j][0];
      ZZ[j] = Z[j][0];
    }

    SUNCheckCall(N_VScaleAddMulti_Serial(nsum, a, X[0], YY, ZZ));

    free(YY);
    free(ZZ);

    return SUN_SUCCESS;
  }

  /* --------------------------
   * Special cases for nvec > 1
   * -------------------------- */

  /* should have called N_VLinearSumVectorArray */
  if (nsum == 1)
  {
    SUNCheckCall(N_VLinearSumVectorArray_Serial(nvec, a[0], X, ONE, Y[0], Z[0]));
    return SUN_SUCCESS;
  }

  /* ----------------------------
   * Compute multiple linear sums
   * ---------------------------- */

  /* get vector length */
  N = NV_LENGTH_S(X[0]);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < nsum; j++)
      {
        yd = NV_DATA_S(Y[j][i]);
        for (k = 0; k < N; k++) { yd[k] += a[j] * xd[k]; }
      }
    }
    return SUN_SUCCESS;
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    for (j = 0; j < nsum; j++)
    {
      yd = NV_DATA_S(Y[j][i]);
      zd = NV_DATA_S(Z[j][i]);
      for (k = 0; k < N; k++) { zd[k] = a[j] * xd[k] + yd[k]; }
    }
  }
  return SUN_SUCCESS;
}